

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

ON_Curve * __thiscall ON_BrepTrim::TrimCurveOf(ON_BrepTrim *this)

{
  int iVar1;
  ON_Brep *pOVar2;
  ON_Curve *pOVar3;
  
  pOVar3 = ON_CurveProxy::ProxyCurve(&this->super_ON_CurveProxy);
  if (pOVar3 == (ON_Curve *)0x0) {
    pOVar2 = this->m_brep;
    if (pOVar2 != (ON_Brep *)0x0) {
      iVar1 = this->m_c2i;
      if (((-1 < (long)iVar1) && (iVar1 < (pOVar2->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count))
         && (pOVar3 = (pOVar2->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[iVar1],
            pOVar3 != (ON_Curve *)0x0)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep.cpp"
                   ,0x32ca,"","ON_BrepTrim ProxyCurve() = nullptr but m_c2i is valid");
        return pOVar3;
      }
    }
    pOVar3 = (ON_Curve *)0x0;
  }
  return pOVar3;
}

Assistant:

const ON_Curve* ON_BrepTrim::TrimCurveOf() const
{
  const ON_Curve* c2 = ProxyCurve();
  if ( !c2 && m_brep && m_c2i >= 0 && m_c2i < m_brep->m_C2.Count() )
  {
    // fallback to get answer if developer forgot to
    // set proxy ptr.
    c2 = m_brep->m_C2[m_c2i];
    if ( c2 )
    {
      ON_ERROR("ON_BrepTrim ProxyCurve() = nullptr but m_c2i is valid");
    }
  }
  return c2;
}